

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_reference(lys_module *module,void *node,char *value,char *where,yytokentype type)

{
  int iVar1;
  char **target;
  
  if ((int)type < 0x135) {
    if (type == IMPORT_KEYWORD) {
      target = (char **)((long)node + 0x30);
    }
    else if (type == INCLUDE_KEYWORD) {
      target = (char **)((long)node + 0x28);
    }
    else {
LAB_0014c69b:
      target = (char **)((long)node + 0x10);
    }
  }
  else {
    if (type == NODE_PRINT) {
      target = (char **)((long)node + 0x10);
      goto LAB_0014c6af;
    }
    if (type == REVISION_KEYWORD) {
      target = (char **)((long)node + 0x20);
    }
    else {
      if (type != MODULE_KEYWORD) goto LAB_0014c69b;
      target = &module->ref;
      where = "module";
    }
  }
  node = (lys_node *)0x0;
LAB_0014c6af:
  iVar1 = yang_check_string(module,target,"reference",where,value,(lys_node *)node);
  return iVar1;
}

Assistant:

int
yang_read_reference(struct lys_module *module, void *node, char *value, char *where, enum yytokentype type)
{
    int ret;
    char *ref = "reference";

    switch (type) {
    case MODULE_KEYWORD:
        ret = yang_check_string(module, &module->ref, ref, "module", value, NULL);
        break;
    case REVISION_KEYWORD:
        ret = yang_check_string(module, &((struct lys_revision *)node)->ref, ref, where, value, NULL);
        break;
    case IMPORT_KEYWORD:
        ret = yang_check_string(module, &((struct lys_import *)node)->ref, ref, where, value, NULL);
        break;
    case INCLUDE_KEYWORD:
        ret = yang_check_string(module, &((struct lys_include *)node)->ref, ref, where, value, NULL);
        break;
    case NODE_PRINT:
        ret = yang_check_string(module, &((struct lys_node *)node)->ref, ref, where, value, node);
        break;
    default:
        ret = yang_check_string(module, &((struct lys_node *)node)->ref, ref, where, value, NULL);
        break;
    }
    return ret;
}